

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readDouble(Vec4 *dst,int size,void *ptr)

{
  float *pfVar1;
  double local_48;
  double aligned [4];
  void *ptr_local;
  int size_local;
  Vec4 *dst_local;
  
  deMemcpy(&local_48,ptr,(long)size << 3);
  pfVar1 = tcu::Vector<float,_4>::operator[](dst,0);
  *pfVar1 = (float)local_48;
  if (1 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,1);
    *pfVar1 = (float)aligned[0];
  }
  if (2 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,2);
    *pfVar1 = (float)aligned[1];
  }
  if (3 < size) {
    pfVar1 = tcu::Vector<float,_4>::operator[](dst,3);
    *pfVar1 = (float)aligned[2];
  }
  return;
}

Assistant:

inline void readDouble (tcu::Vec4& dst, const int size, const void* ptr)
{
	double aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(double));

				   dst[0] = float(aligned[0]);
	if (size >= 2) dst[1] = float(aligned[1]);
	if (size >= 3) dst[2] = float(aligned[2]);
	if (size >= 4) dst[3] = float(aligned[3]);
}